

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O1

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  long in_FS_OFFSET;
  
  StatsAccumulator::ReportPercentage
            (accum,"Geometry/Buffer cache hits",*(int64_t *)(in_FS_OFFSET + -0x20),
             *(int64_t *)(in_FS_OFFSET + -0x18));
  *(undefined8 *)(in_FS_OFFSET + -0x20) = 0;
  *(undefined8 *)(in_FS_OFFSET + -0x18) = 0;
  return;
}

Assistant:

MaterialHandle MaterialHandle::Create(
    const std::string &name, const TextureParameterDictionary &parameters,
    Image *normalMap,
    /*const */ std::map<std::string, MaterialHandle> &namedMaterials, const FileLoc *loc,
    Allocator alloc) {
    MaterialHandle material;
    if (name.empty() || name == "none")
        return nullptr;
    else if (name == "diffuse")
        material = DiffuseMaterial::Create(parameters, normalMap, loc, alloc);
    else if (name == "coateddiffuse")
        material = CoatedDiffuseMaterial::Create(parameters, normalMap, loc, alloc);
    else if (name == "coatedconductor")
        material = CoatedConductorMaterial::Create(parameters, normalMap, loc, alloc);
    else if (name == "diffusetransmission")
        material = DiffuseTransmissionMaterial::Create(parameters, normalMap, loc, alloc);
    else if (name == "dielectric")
        material = DielectricMaterial::Create(parameters, normalMap, loc, alloc);
    else if (name == "thindielectric")
        material = ThinDielectricMaterial::Create(parameters, normalMap, loc, alloc);
    else if (name == "hair")
        material = HairMaterial::Create(parameters, loc, alloc);
    else if (name == "conductor")
        material = ConductorMaterial::Create(parameters, normalMap, loc, alloc);
    else if (name == "measured")
        material = MeasuredMaterial::Create(parameters, normalMap, loc, alloc);
    else if (name == "subsurface")
        material = SubsurfaceMaterial::Create(parameters, normalMap, loc, alloc);
    else if (name == "mix") {
        std::vector<std::string> materials = parameters.GetStringArray("materials");
        if (materials.size() != 2)
            ErrorExit(
                "Must provide two values for \"string materials\" for mix material.");

        MaterialHandle materialHandles[2];
        for (int i = 0; i < 2; ++i) {
            auto iter = namedMaterials.find(materials[i]);
            if (iter == namedMaterials.end())
                ErrorExit("%s: named material not found.", materials[i]);
            materialHandles[i] = iter->second;
        }
        material = MixMaterial::Create(materialHandles, parameters, loc, alloc);
    } else
        ErrorExit(loc, "%s: material type unknown.", name);

    if (!material)
        ErrorExit(loc, "%s: unable to create material.", name);

    parameters.ReportUnused();
    ++nMaterialsCreated;
    return material;
}